

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O2

void __thiscall
perf::suite::suite(suite *this,
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_>_>
                  *cases,string *name)

{
  pointer ppVar1;
  pointer name_00;
  function<bool_()> fStack_48;
  
  (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  ppVar1 = (cases->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (name_00 = (cases->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; name_00 != ppVar1;
      name_00 = name_00 + 1) {
    std::function<bool_()>::function(&fStack_48,&name_00->second);
    add_case(this,&name_00->first,&fStack_48);
    std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  }
  return;
}

Assistant:

explicit suite(const std::vector<std::pair<std::string, perf_func>> &cases, std::string name = "PerfSuite") : m_name(std::move(name))
        {
            for (const auto &c : cases)
                add_case(c.first, c.second);
        }